

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O1

void polyscope::draw(bool withUI,bool withContextCallback)

{
  _Atomic_word *p_Var1;
  long lVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  Engine *pEVar5;
  bool bVar6;
  int iVar7;
  TransparencyMode TVar8;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *s;
  undefined8 *puVar9;
  undefined7 in_register_00000039;
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  *__range2;
  pair<polyscope::Structure_*,_unsigned_long> pVar10;
  GenericWeakHandle local_58;
  long *local_40;
  
  processLazyProperties();
  (*render::engine->_vptr_Engine[0xe])();
  (*render::engine->_vptr_Engine[2])();
  render::Engine::setBackgroundColor(render::engine,(vec3)ZEXT812(0));
  render::Engine::setBackgroundAlpha(render::engine,0.0);
  (*render::engine->_vptr_Engine[1])();
  if ((((int)CONCAT71(in_register_00000039,withUI) != 0) &&
      ((*render::engine->_vptr_Engine[0x1f])(), *(char *)(DAT_005fdaa8 + -8) == '\x01')) &&
     (buildUserGuiAndInvokeCallback(), options::buildGui == '\x01')) {
    if (options::buildDefaultGuiPanels == '\x01') {
      buildPolyscopeGui();
      buildStructureGui();
      buildPickGui();
    }
    puVar4 = DAT_005fdd38;
    if (state::widgets != DAT_005fdd38) {
      puVar9 = state::widgets;
      do {
        lVar2 = puVar9[1];
        local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*puVar9;
        local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar9[1];
        if (lVar2 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
          }
        }
        local_58.targetUniqueID = puVar9[2];
        local_40 = (long *)puVar9[3];
        bVar6 = GenericWeakHandle::isValid(&local_58);
        if (bVar6) {
          (**(code **)(*local_40 + 0x20))();
        }
        if (local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_weak_count;
            iVar7 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar7 = (local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi)->_M_weak_count;
            (local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_weak_count = iVar7 + -1;
          }
          if (iVar7 == 1) {
            (*(local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base[3])();
          }
        }
        puVar9 = puVar9 + 4;
      } while (puVar9 != puVar4);
    }
  }
  if ((withContextCallback) && (*(long *)(DAT_005fdaa8 + -0x18) != 0)) {
    (**(code **)(DAT_005fdaa8 + -0x10))(DAT_005fdaa8 + -0x28);
  }
  processLazyProperties();
  if (((anonymous_namespace)::redrawNextFrame != '\x01') || (options::alwaysRedraw == '\x01')) {
    processLazyProperties();
    (*render::engine->_vptr_Engine[0x2c])();
    pEVar5 = render::engine;
    peVar3 = (render::engine->sceneBuffer).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar3->clearColor).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (peVar3->clearColor).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    (peVar3->clearColor).field_2.z = 0.0;
    peVar3 = (pEVar5->sceneBuffer).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3->clearAlpha = 0.0;
    (*peVar3->_vptr_FrameBuffer[4])();
    iVar7 = (*render::engine->_vptr_Engine[6])();
    if (((char)iVar7 != '\0') && (view::ensureViewValid(), options::renderScene == '\x01')) {
      TVar8 = render::Engine::getTransparencyMode(render::engine);
      pEVar5 = render::engine;
      if (TVar8 == Pretty) {
        peVar3 = (render::engine->sceneBufferFinal).
                 super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (peVar3->clearColor).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
        (peVar3->clearColor).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
        iVar7 = 0;
        (peVar3->clearColor).field_2.z = 0.0;
        peVar3 = (pEVar5->sceneBufferFinal).
                 super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar3->clearAlpha = 0.0;
        (*peVar3->_vptr_FrameBuffer[4])();
        (*render::engine->_vptr_Engine[10])(render::engine,0);
        (*((render::engine->sceneDepthMinFrame).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_FrameBuffer[4])();
        if (0 < options::transparencyRenderPasses) {
          do {
            (*render::engine->_vptr_Engine[6])();
            (*render::engine->_vptr_Engine[5])();
            (*render::engine->_vptr_Engine[0x2c])();
            drawStructures();
            render::GroundPlane::draw(&render::engine->groundPlane,iVar7 != 0);
            puVar4 = DAT_005fdd50;
            puVar9 = state::slicePlanes;
            if (iVar7 == 0) {
              for (; puVar9 != puVar4; puVar9 = puVar9 + 1) {
                SlicePlane::draw((SlicePlane *)*puVar9);
              }
              (*render::engine->_vptr_Engine[0x2c])();
              drawStructuresDelayed();
            }
            (*((render::engine->sceneBufferFinal).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_FrameBuffer[2])();
            (*render::engine->_vptr_Engine[10])(render::engine,4);
            (*render::engine->_vptr_Engine[0xb])(render::engine,2);
            (*((render::engine->compositePeel).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ShaderProgram[0x24])();
            render::Engine::updateMinDepthTexture(render::engine);
            iVar7 = iVar7 + 1;
          } while (iVar7 < options::transparencyRenderPasses);
        }
      }
      else {
        (*render::engine->_vptr_Engine[0x2c])();
        drawStructures();
        render::GroundPlane::draw(&render::engine->groundPlane,false);
        puVar4 = DAT_005fdd50;
        for (puVar9 = state::slicePlanes; puVar9 != puVar4; puVar9 = puVar9 + 1) {
          SlicePlane::draw((SlicePlane *)*puVar9);
        }
        (*render::engine->_vptr_Engine[0x2c])();
        drawStructuresDelayed();
        peVar3 = (render::engine->sceneBuffer).
                 super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar3->_vptr_FrameBuffer[0xe])
                  (peVar3,(render::engine->sceneBufferFinal).
                          super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      }
    }
    (anonymous_namespace)::redrawNextFrame = '\x01';
  }
  (*render::engine->_vptr_Engine[2])();
  if (options::debugDrawPickBuffer == '\x01') {
    pVar10 = pick::evaluatePickQuery(-1,-1);
    peVar3 = (render::engine->pickFramebuffer).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_FrameBuffer[0xe])
              (peVar3,(render::engine->displayBuffer).
                      super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,pVar10.second);
  }
  else {
    (*render::engine->_vptr_Engine[9])(render::engine,&render::engine->sceneColorFinal);
  }
  if (withUI) {
    (*render::engine->_vptr_Engine[2])();
    puVar4 = DAT_005fdd38;
    if (state::widgets != DAT_005fdd38) {
      puVar9 = state::widgets;
      do {
        lVar2 = puVar9[1];
        local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*puVar9;
        local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar9[1];
        if (lVar2 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
          }
        }
        local_58.targetUniqueID = puVar9[2];
        local_40 = (long *)puVar9[3];
        bVar6 = GenericWeakHandle::isValid(&local_58);
        if (bVar6) {
          (**(code **)(*local_40 + 0x10))();
        }
        if (local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_weak_count;
            iVar7 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar7 = (local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi)->_M_weak_count;
            (local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_weak_count = iVar7 + -1;
          }
          if (iVar7 == 1) {
            (*(local_58.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base[3])();
          }
        }
        puVar9 = puVar9 + 4;
      } while (puVar9 != puVar4);
    }
    (*render::engine->_vptr_Engine[2])();
    (*render::engine->_vptr_Engine[0x20])();
  }
  return;
}

Assistant:

void draw(bool withUI, bool withContextCallback) {
  processLazyProperties();

  // Update buffer and context
  render::engine->makeContextCurrent();
  render::engine->bindDisplay();
  render::engine->setBackgroundColor({0., 0., 0.});
  render::engine->setBackgroundAlpha(0);
  render::engine->clearDisplay();

  if (withUI) {
    render::engine->ImGuiNewFrame();
  }

  // Build the GUI components
  if (withUI) {
    if (contextStack.back().drawDefaultUI) {

      // Note: It is important to build the user GUI first, because it is likely that callbacks there will modify
      // polyscope data. If we do these modifications happen later in the render cycle, they might invalidate data which
      // is necessary when ImGui::Render() happens below.
      buildUserGuiAndInvokeCallback();

      if (options::buildGui) {
        if (options::buildDefaultGuiPanels) {
          buildPolyscopeGui();
          buildStructureGui();
          buildPickGui();
        }

        for (WeakHandle<Widget> wHandle : state::widgets) {
          if (wHandle.isValid()) {
            Widget& w = wHandle.get();
            w.buildGUI();
          }
        }
      }
    }
  }

  // Execute the context callback, if there is one.
  // This callback is a Polyscope implementation detail, which is distinct from the userCallback (which gets called
  // above)
  if (withContextCallback && contextStack.back().callback) {
    (contextStack.back().callback)();
  }

  processLazyProperties();

  // Draw structures in the scene
  if (redrawNextFrame || options::alwaysRedraw) {
    renderScene();
    redrawNextFrame = false;
  }
  renderSceneToScreen();

  // Draw the GUI
  if (withUI) {
    // render widgets
    render::engine->bindDisplay();
    for (WeakHandle<Widget> wHandle : state::widgets) {
      if (wHandle.isValid()) {
        Widget& w = wHandle.get();
        w.draw();
      }
    }

    render::engine->bindDisplay();
    render::engine->ImGuiRender();
  }
}